

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O2

void __thiscall
duckdb::UncompressedStringStorage::WriteStringMemory
          (UncompressedStringStorage *this,ColumnSegment *segment,string_t string,
          block_id_t *result_block,int32_t *result_offset)

{
  __uniq_ptr_impl<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_> *__u;
  element_type *peVar1;
  uint uVar2;
  templated_unique_single_t __p;
  BufferManager *pBVar3;
  CompressedSegmentState *pCVar4;
  ulong uVar5;
  pointer pSVar6;
  BlockManager *this_00;
  idx_t iVar7;
  BlockHandle *pBVar8;
  data_ptr_t pdVar9;
  char *__src;
  templated_unique_single_t new_block;
  shared_ptr<duckdb::BlockHandle,_true> block;
  BufferHandle local_70;
  BufferHandle handle;
  string_t string_local;
  
  block.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  block.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  string_local.value._0_8_ = segment;
  string_local.value.pointer.ptr = string.value._0_8_;
  BufferHandle::BufferHandle(&handle);
  pBVar3 = BufferManager::GetBufferManager(*(DatabaseInstance **)(this + 0x20));
  local_70.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = *(element_type **)(this + 0xd8);
  pCVar4 = optional_ptr<duckdb::CompressedSegmentState,_true>::operator->
                     ((optional_ptr<duckdb::CompressedSegmentState,_true> *)&local_70);
  uVar2 = (uint)segment;
  __u = (__uniq_ptr_impl<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_> *)
        (pCVar4 + 1);
  uVar5 = (ulong)(uVar2 + 4);
  if (pCVar4[1]._vptr_CompressedSegmentState != (_func_int **)0x0) {
    pSVar6 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
             operator->((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>
                         *)__u);
    iVar7 = pSVar6->offset;
    pSVar6 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
             operator->((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>
                         *)__u);
    if (iVar7 + uVar5 < pSVar6->size) {
      pSVar6 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
               operator->((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>
                           *)__u);
      (*pBVar3->_vptr_BufferManager[7])(&local_70,pBVar3,pSVar6);
      BufferHandle::operator=(&handle,&local_70);
      BufferHandle::~BufferHandle(&local_70);
      goto LAB_004a3911;
    }
  }
  this_00 = ColumnSegment::GetBlockManager((ColumnSegment *)this);
  iVar7 = BlockManager::GetBlockSize(this_00);
  if (iVar7 < uVar5) {
    iVar7 = uVar5;
  }
  make_uniq<duckdb::StringBlock>();
  pSVar6 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
           operator->(&new_block);
  pSVar6->offset = 0;
  pSVar6 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
           operator->(&new_block);
  pSVar6->size = iVar7;
  (*pBVar3->_vptr_BufferManager[4])(&local_70,pBVar3,8,iVar7,0);
  BufferHandle::operator=(&handle,&local_70);
  BufferHandle::~BufferHandle(&local_70);
  shared_ptr<duckdb::BlockHandle,_true>::operator=(&block,&handle.handle);
  pBVar8 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&block);
  peVar1 = (element_type *)pBVar8->block_id;
  local_70.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::operator*
                 (&new_block);
  local_70.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar1;
  ::std::
  _Hashtable<long,std::pair<long_const,std::reference_wrapper<duckdb::StringBlock>>,std::allocator<std::pair<long_const,std::reference_wrapper<duckdb::StringBlock>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<long,duckdb::StringBlock&>>
            ((_Hashtable<long,std::pair<long_const,std::reference_wrapper<duckdb::StringBlock>>,std::allocator<std::pair<long_const,std::reference_wrapper<duckdb::StringBlock>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)(pCVar4 + 2));
  pSVar6 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
           operator->(&new_block);
  shared_ptr<duckdb::BlockHandle,_true>::operator=(&pSVar6->block,&block);
  pSVar6 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
           operator->(&new_block);
  ::std::__uniq_ptr_impl<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>::operator=
            ((__uniq_ptr_impl<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_> *)
             &pSVar6->next,__u);
  __p = new_block;
  new_block.super_unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>._M_t.
  super___uniq_ptr_impl<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::StringBlock_*,_std::default_delete<duckdb::StringBlock>_>.
  super__Head_base<0UL,_duckdb::StringBlock_*,_false>._M_head_impl =
       (unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>)
       (__uniq_ptr_data<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true,_true>)
       0x0;
  ::std::__uniq_ptr_impl<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>::reset
            (__u,(pointer)__p.
                          super_unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::StringBlock_*,_std::default_delete<duckdb::StringBlock>_>
                          .super__Head_base<0UL,_duckdb::StringBlock_*,_false>._M_head_impl);
  ::std::unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>::~unique_ptr
            (&new_block.
              super_unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>);
LAB_004a3911:
  pSVar6 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
           operator->((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>
                       *)__u);
  pBVar8 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&pSVar6->block);
  *string.value._8_8_ = pBVar8->block_id;
  pSVar6 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
           operator->((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>
                       *)__u);
  *(int *)result_block = (int)pSVar6->offset;
  pdVar9 = BufferHandle::Ptr(&handle);
  pSVar6 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
           operator->((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>
                       *)__u);
  iVar7 = pSVar6->offset;
  *(uint *)(pdVar9 + iVar7) = uVar2;
  __src = string.value._0_8_;
  if (uVar2 < 0xd) {
    __src = (char *)((long)&string_local.value + 4);
  }
  switchD_00916250::default(pdVar9 + iVar7 + 4,__src,(ulong)segment & 0xffffffff);
  pSVar6 = unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>::
           operator->((unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>,_true>
                       *)__u);
  pSVar6->offset = pSVar6->offset + uVar5;
  BufferHandle::~BufferHandle(&handle);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&block.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void UncompressedStringStorage::WriteStringMemory(ColumnSegment &segment, string_t string, block_id_t &result_block,
                                                  int32_t &result_offset) {
	auto total_length = UnsafeNumericCast<uint32_t>(string.GetSize() + sizeof(uint32_t));
	shared_ptr<BlockHandle> block;
	BufferHandle handle;

	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	auto &state = segment.GetSegmentState()->Cast<UncompressedStringSegmentState>();
	// check if the string fits in the current block
	if (!state.head || state.head->offset + total_length >= state.head->size) {
		// string does not fit, allocate space for it
		// create a new string block
		auto alloc_size = MaxValue<idx_t>(total_length, segment.GetBlockManager().GetBlockSize());
		auto new_block = make_uniq<StringBlock>();
		new_block->offset = 0;
		new_block->size = alloc_size;
		// allocate an in-memory buffer for it
		handle = buffer_manager.Allocate(MemoryTag::OVERFLOW_STRINGS, alloc_size, false);
		block = handle.GetBlockHandle();
		state.overflow_blocks.insert(make_pair(block->BlockId(), reference<StringBlock>(*new_block)));
		new_block->block = std::move(block);
		new_block->next = std::move(state.head);
		state.head = std::move(new_block);
	} else {
		// string fits, copy it into the current block
		handle = buffer_manager.Pin(state.head->block);
	}

	result_block = state.head->block->BlockId();
	result_offset = UnsafeNumericCast<int32_t>(state.head->offset);

	// copy the string and the length there
	auto ptr = handle.Ptr() + state.head->offset;
	Store<uint32_t>(UnsafeNumericCast<uint32_t>(string.GetSize()), ptr);
	ptr += sizeof(uint32_t);
	memcpy(ptr, string.GetData(), string.GetSize());
	state.head->offset += total_length;
}